

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_buffer.hpp
# Opt level: O0

Mat * __thiscall CircularBuffer<cv::Mat_*>::operator[](CircularBuffer<cv::Mat_*> *this,int index)

{
  uint local_20;
  int real_index;
  int index_local;
  CircularBuffer<cv::Mat_*> *this_local;
  
  if (((this->count_of_elements == 0) || ((int)(this->count_of_elements - 1) < index)) ||
     (SBORROW4(index,-this->count_of_elements) != (int)(index + this->count_of_elements) < 0)) {
    this_local = (CircularBuffer<cv::Mat_*> *)0x0;
  }
  else {
    if (index < 0) {
      local_20 = (this->last_element_index + this->count_of_slots + 1 + index) %
                 this->count_of_slots;
    }
    else {
      local_20 = (this->first_element_index + index) % this->count_of_slots;
    }
    this_local = (CircularBuffer<cv::Mat_*> *)this->data[(int)local_20];
  }
  return (Mat *)this_local;
}

Assistant:

T *CircularBuffer<T *>::operator[](int index) const
{
    if(count_of_elements == 0 || index > ((int) count_of_elements) - 1 || index < -1 * ((int) count_of_elements)) {
        return nullptr;
    }
    int real_index;
    if(index >= 0) {
        real_index = (first_element_index + index) % count_of_slots;
    } else {
        //we add count_of_slots here to be sure that left side of operator % is positive.
        real_index = (((int) last_element_index) + count_of_slots + 1 + index) % count_of_slots;
    }
    return data[real_index];
}